

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrintNumber(UNITY_INT number_to_print)

{
  if (number_to_print < 0) {
    putchar(0x2d);
    number_to_print = -number_to_print;
  }
  UnityPrintNumberUnsigned(number_to_print);
  return;
}

Assistant:

void UnityPrintNumber(const UNITY_INT number_to_print)
{
    UNITY_UINT number = (UNITY_UINT)number_to_print;

    if (number_to_print < 0)
    {
        /* A negative number, including MIN negative */
        UNITY_OUTPUT_CHAR('-');
        number = (UNITY_UINT)(-number_to_print);
    }
    UnityPrintNumberUnsigned(number);
}